

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O3

int TRUST_TOKEN_derive_key_from_secret
              (TRUST_TOKEN_METHOD *method,uint8_t *out_priv_key,size_t *out_priv_key_len,
              size_t max_priv_key_len,uint8_t *out_pub_key,size_t *out_pub_key_len,
              size_t max_pub_key_len,uint32_t id,uint8_t *secret,size_t secret_len)

{
  int iVar1;
  int line;
  CBB priv_cbb;
  CBB local_90;
  CBB local_60;
  
  CBB_init_fixed(&local_60,out_priv_key,max_priv_key_len);
  CBB_init_fixed(&local_90,out_pub_key,max_pub_key_len);
  iVar1 = CBB_add_u32(&local_60,id);
  line = 0xb6;
  if ((iVar1 != 0) && (iVar1 = CBB_add_u32(&local_90,id), iVar1 != 0)) {
    iVar1 = (*method->derive_key_from_secret)(&local_60,&local_90,secret,secret_len);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = CBB_finish(&local_60,(uint8_t **)0x0,out_priv_key_len);
    line = 0xc1;
    if ((iVar1 != 0) && (iVar1 = CBB_finish(&local_90,(uint8_t **)0x0,out_pub_key_len), iVar1 != 0))
    {
      return 1;
    }
  }
  ERR_put_error(0x20,0,0x65,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                ,line);
  return 0;
}

Assistant:

int TRUST_TOKEN_derive_key_from_secret(
    const TRUST_TOKEN_METHOD *method, uint8_t *out_priv_key,
    size_t *out_priv_key_len, size_t max_priv_key_len, uint8_t *out_pub_key,
    size_t *out_pub_key_len, size_t max_pub_key_len, uint32_t id,
    const uint8_t *secret, size_t secret_len) {
  // Prepend the key ID in front of the PMBTokens format.
  CBB priv_cbb, pub_cbb;
  CBB_init_fixed(&priv_cbb, out_priv_key, max_priv_key_len);
  CBB_init_fixed(&pub_cbb, out_pub_key, max_pub_key_len);
  if (!CBB_add_u32(&priv_cbb, id) ||  //
      !CBB_add_u32(&pub_cbb, id)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (!method->derive_key_from_secret(&priv_cbb, &pub_cbb, secret,
                                      secret_len)) {
    return 0;
  }

  if (!CBB_finish(&priv_cbb, NULL, out_priv_key_len) ||
      !CBB_finish(&pub_cbb, NULL, out_pub_key_len)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_BUFFER_TOO_SMALL);
    return 0;
  }

  return 1;
}